

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall Assimp::HMPImporter::InternReadFile_HMP4(HMPImporter *this)

{
  DeadlyImportError *this_00;
  allocator local_31;
  string local_30;
  HMPImporter *local_10;
  HMPImporter *this_local;
  
  local_10 = this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"HMP4 is currently not supported",&local_31);
  DeadlyImportError::DeadlyImportError(this_00,&local_30);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void HMPImporter::InternReadFile_HMP4( )
{
    throw DeadlyImportError("HMP4 is currently not supported");
}